

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetPSTATPortStatus(ndicapi *pol,int port)

{
  int iVar1;
  unsigned_long uVar2;
  char (*pacVar3) [32];
  
  if (port - 0x31U < 3) {
    pacVar3 = pol->PstatBasic + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 0;
    }
    pacVar3 = pol->PstatPassiveBasic + (port - 0x41U);
  }
  iVar1 = 0;
  if (((*pacVar3)[0] != '\0') && ((*pacVar3)[0] != 'U')) {
    uVar2 = ndiHexToUnsignedLong(*pacVar3 + 0x1e,2);
    iVar1 = (int)uVar2;
  }
  return iVar1;
}

Assistant:

ndicapiExport int ndiGetPSTATPortStatus(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatBasic[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveBasic[port - 'A'];
  }
  else
  {
    return 0;
  }

  // the 'U' is for UNOCCUPIED
  if (*dp == 'U' || *dp == '\0')
  {
    return 0;
  }

  // skip to the last two characters
  dp += 30;

  return (int)ndiHexToUnsignedLong(dp, 2);
}